

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

FunctionProxy * __thiscall Js::ScriptFunction::GetFunctionProxy(ScriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionProxy *pFVar4;
  
  pFVar4 = (((this->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
           functionBodyImpl).ptr;
  if (pFVar4 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x115,"(this->functionInfo->HasBody())",
                                "this->functionInfo->HasBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (((this->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
             functionBodyImpl).ptr;
  }
  return pFVar4;
}

Assistant:

FunctionProxy * ScriptFunction::GetFunctionProxy() const
    {
        Assert(this->functionInfo->HasBody());
        return this->functionInfo->GetFunctionProxy();
    }